

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O1

void __thiscall nuraft::asio_service::asio_service(asio_service *this,options *_opt,ptr<logger> *_l)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  asio_service_impl *this_00;
  ptr<logger> local_30;
  
  (this->super_delayed_task_scheduler)._vptr_delayed_task_scheduler =
       (_func_int **)&PTR__asio_service_0061f0b0;
  (this->super_rpc_client_factory)._vptr_rpc_client_factory =
       (_func_int **)&PTR__asio_service_0061f0e8;
  this_00 = (asio_service_impl *)operator_new(0x348);
  local_30.super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (_l->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_30.super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_l->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_30.super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30.super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_30.super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_30.super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_30.super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  asio_service_impl::asio_service_impl(this_00,_opt,&local_30);
  if (local_30.super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  this->impl_ = this_00;
  (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (_l->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (_l->super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  return;
}

Assistant:

asio_service::asio_service(const options& _opt, ptr<logger> _l)
    : impl_(new asio_service_impl(_opt, _l))
    , l_(_l)
    {}